

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_event_listener.cpp
# Opt level: O0

void __thiscall
HawkTracer::parser::DebugEventListener::_process_event(DebugEventListener *this,Event *event)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  undefined1 local_88 [16];
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  undefined8 local_18;
  Event *event_local;
  DebugEventListener *this_local;
  
  local_18 = event;
  event_local = (Event *)this;
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  Event::get_klass((Event *)local_48);
  std::
  __shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_48);
  EventKlass::get_name_abi_cxx11_((EventKlass *)&stack0xffffffffffffffc8);
  poVar1 = std::operator<<(poVar1,(string *)&stack0xffffffffffffffc8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::shared_ptr<const_HawkTracer::parser::EventKlass>::~shared_ptr
            ((shared_ptr<const_HawkTracer::parser::EventKlass> *)local_48);
  print_event((Event *)local_18,2);
  Event::get_klass((Event *)local_88);
  std::
  __shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)local_88);
  EventKlass::get_name_abi_cxx11_((EventKlass *)local_78);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](&this->_event_stats,(key_type *)local_78);
  *pmVar2 = *pmVar2 + 1;
  std::__cxx11::string::~string((string *)local_78);
  std::shared_ptr<const_HawkTracer::parser::EventKlass>::~shared_ptr
            ((shared_ptr<const_HawkTracer::parser::EventKlass> *)local_88);
  return;
}

Assistant:

void DebugEventListener::_process_event(const Event& event)
{
    std::cout << std::endl << event.get_klass()->get_name() << std::endl;
    print_event(event, 2);

    _event_stats[event.get_klass()->get_name()]++;
}